

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_max_jump_limit(REF_DBL *recon,REF_GRID ref_grid,REF_DBL max_jump)

{
  REF_NODE ref_node;
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  REF_DBL *pRVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  REF_CELL ref_cell;
  double dVar10;
  double dVar11;
  double dVar12;
  REF_INT nnode;
  REF_DBL *local_1068;
  double local_1060;
  double local_1058;
  double local_1048;
  undefined1 local_1038 [16];
  double local_1028;
  REF_INT node_list [1000];
  
  if (ref_grid->twod == 0) {
    ref_cell = ref_grid->cell[8];
  }
  else {
    ref_cell = ref_grid->cell[3];
  }
  local_1058 = max_jump * 4.0;
  ref_node = ref_grid->node;
  local_1048 = local_1058;
  if (local_1058 <= -local_1058) {
    local_1048 = -local_1058;
  }
  lVar7 = 0;
  local_1068 = recon;
  do {
    if (ref_node->max <= lVar7) {
      uVar2 = ref_node_ghost_dbl(ref_node,local_1068,6);
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        pcVar9 = "update ghosts";
        uVar5 = 0x535;
LAB_001d0b6b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               uVar5,"ref_recon_max_jump_limit",(ulong)uVar2,pcVar9);
      }
      return uVar2;
    }
    if (-1 < ref_node->global[lVar7]) {
      uVar2 = ref_cell_node_list_around(ref_cell,(REF_INT)lVar7,1000,&nnode,node_list);
      if (uVar2 != 0) {
        pcVar9 = "first halo of nodes";
        uVar5 = 0x517;
        goto LAB_001d0b6b;
      }
      uVar3 = (ulong)(uint)nnode;
      if (nnode < 1) {
        uVar3 = 0;
      }
      dVar12 = 0.0;
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pRVar6 = ref_node->real;
        lVar8 = (long)node_list[uVar4];
        dVar11 = SQRT((pRVar6[lVar8 * 0xf + 2] - pRVar6[lVar7 * 0xf + 2]) *
                      (pRVar6[lVar8 * 0xf + 2] - pRVar6[lVar7 * 0xf + 2]) +
                      (pRVar6[lVar8 * 0xf + 1] - pRVar6[lVar7 * 0xf + 1]) *
                      (pRVar6[lVar8 * 0xf + 1] - pRVar6[lVar7 * 0xf + 1]) +
                      (pRVar6[lVar8 * 0xf] - pRVar6[lVar7 * 0xf]) *
                      (pRVar6[lVar8 * 0xf] - pRVar6[lVar7 * 0xf]));
        dVar10 = dVar11;
        if (uVar4 != 0) {
          dVar10 = dVar12;
        }
        dVar12 = dVar10;
        if (dVar11 <= dVar10) {
          dVar12 = dVar11;
        }
      }
      dVar10 = dVar12 * 1e+20 * dVar12;
      if (dVar10 <= -dVar10) {
        dVar10 = -dVar10;
      }
      if (local_1048 < dVar10) {
        pRVar6 = local_1068 + lVar7 * 6;
        local_1060 = dVar12;
        uVar2 = ref_matrix_diag_m(pRVar6,(REF_DBL *)local_1038);
        if (uVar2 != 0) {
          pcVar9 = "eigen decomp";
          uVar5 = 0x52a;
          goto LAB_001d0b6b;
        }
        dVar12 = local_1058 / (local_1060 * local_1060);
        auVar1._8_8_ = dVar12;
        auVar1._0_8_ = dVar12;
        local_1038 = minpd(local_1038,auVar1);
        if (dVar12 <= local_1028) {
          local_1028 = dVar12;
        }
        uVar2 = ref_matrix_form_m((REF_DBL *)local_1038,pRVar6);
        if (uVar2 != 0) {
          pcVar9 = "re-form hess";
          uVar5 = 0x531;
          goto LAB_001d0b6b;
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_recon_max_jump_limit(REF_DBL *recon, REF_GRID ref_grid,
                                            REF_DBL max_jump) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL radius, dist;
  REF_DBL eig_ceiling;
  REF_INT nnode, node_list[REF_RECON_MAX_DEGREE],
      max_node = REF_RECON_MAX_DEGREE;
  REF_DBL diag_system[12];

  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cell_node_list_around(ref_cell, node, max_node, &nnode, node_list),
        "first halo of nodes");
    radius = 0.0;
    for (i = 0; i < nnode; i++) {
      dist = sqrt(pow(ref_node_xyz(ref_node, 0, node_list[i]) -
                          ref_node_xyz(ref_node, 0, node),
                      2) +
                  pow(ref_node_xyz(ref_node, 1, node_list[i]) -
                          ref_node_xyz(ref_node, 1, node),
                      2) +
                  pow(ref_node_xyz(ref_node, 2, node_list[i]) -
                          ref_node_xyz(ref_node, 2, node),
                      2));
      if (i == 0) radius = dist;
      radius = MIN(radius, dist);
    }
    /* 2nd order central finite difference */
    if (ref_math_divisible(4 * max_jump, radius * radius)) {
      eig_ceiling = (4 * max_jump) / (radius * radius);

      RSS(ref_matrix_diag_m(&(recon[6 * node]), diag_system), "eigen decomp");
      ref_matrix_eig(diag_system, 0) =
          MIN(ref_matrix_eig(diag_system, 0), eig_ceiling);
      ref_matrix_eig(diag_system, 1) =
          MIN(ref_matrix_eig(diag_system, 1), eig_ceiling);
      ref_matrix_eig(diag_system, 2) =
          MIN(ref_matrix_eig(diag_system, 2), eig_ceiling);
      RSS(ref_matrix_form_m(diag_system, &(recon[6 * node])), "re-form hess");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, recon, 6), "update ghosts");

  return REF_SUCCESS;
}